

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<std::pair<int,_long>,_60> * __thiscall
TPZManVector<std::pair<int,_long>,_60>::operator=
          (TPZManVector<std::pair<int,_long>,_60> *this,TPZManVector<std::pair<int,_long>,_60> *copy
          )

{
  pair<int,_long> *ppVar1;
  pair<int,_long> *ppVar2;
  long lVar3;
  ulong uVar4;
  
  if (this == copy) {
    return this;
  }
  uVar4 = (copy->super_TPZVec<std::pair<int,_long>_>).fNElements;
  lVar3 = (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc;
  if ((lVar3 < (long)uVar4) &&
     (ppVar2 = (this->super_TPZVec<std::pair<int,_long>_>).fStore,
     ppVar2 != this->fExtAlloc && ppVar2 != (pair<int,_long> *)0x0)) {
    operator_delete__(ppVar2);
    lVar3 = 0;
    (this->super_TPZVec<std::pair<int,_long>_>).fStore = (pair<int,_long> *)0x0;
    (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0;
  }
  if ((long)uVar4 < 0x3d) {
    ppVar2 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
    if (ppVar2 != (pair<int,_long> *)0x0 && ppVar2 != this->fExtAlloc) {
      operator_delete__(ppVar2);
    }
    (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0;
    (this->super_TPZVec<std::pair<int,_long>_>).fStore = this->fExtAlloc;
  }
  else {
    if ((long)uVar4 <= lVar3) {
      (this->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar4;
      goto LAB_00b24ca5;
    }
    ppVar1 = (pair<int,_long> *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 * 0x10);
    ppVar2 = ppVar1;
    do {
      ppVar2->first = 0;
      ppVar2->second = 0;
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1 + uVar4);
    (this->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar1;
    (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = uVar4;
  }
  (this->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar4;
  if ((long)uVar4 < 1) {
    return this;
  }
LAB_00b24ca5:
  ppVar2 = (copy->super_TPZVec<std::pair<int,_long>_>).fStore;
  ppVar1 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
  lVar3 = 8;
  do {
    *(undefined4 *)((long)ppVar1 + lVar3 + -8) = *(undefined4 *)((long)ppVar2 + lVar3 + -8);
    *(undefined8 *)((long)&ppVar1->first + lVar3) = *(undefined8 *)((long)&ppVar2->first + lVar3);
    lVar3 = lVar3 + 0x10;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}